

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomcp.cpp
# Opt level: O2

ValuedAction
despot::POMCP::Evaluate
          (VNode *root,vector<despot::State_*,_std::allocator<despot::State_*>_> *particles,
          RandomStreams *streams,DSPOMDP *model,POMCPPrior *prior)

{
  bool bVar1;
  int iVar2;
  uint action;
  int iVar3;
  ACT_TYPE _action;
  pointer ppSVar4;
  undefined4 extraout_var;
  QNode *this;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_despot::VNode_*>,_std::_Select1st<std::pair<const_unsigned_long,_despot::VNode_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
  *this_00;
  iterator iVar5;
  mapped_type *ppVVar6;
  pointer ppSVar7;
  long lVar8;
  ulong uVar9;
  mapped_type vnode;
  long lVar10;
  undefined1 auVar11 [16];
  ValuedAction VVar12;
  OBS_TYPE obs;
  double reward;
  double local_90;
  double local_80;
  double local_68;
  key_type local_60;
  ulong local_58;
  State *local_50;
  double local_48;
  ValuedAction local_40;
  
  ppSVar4 = (particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  ppSVar7 = (particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  for (lVar10 = 0; (long)ppSVar7 - (long)ppSVar4 >> 3 != lVar10; lVar10 = lVar10 + 1) {
    ppSVar4[lVar10]->scenario_id = (int)lVar10;
  }
  local_90 = 0.0;
  uVar9 = 0;
  do {
    if ((ulong)((long)ppSVar7 - (long)ppSVar4 >> 3) <= uVar9) {
      _action = UpperBoundAction(root,0.0);
      lVar10 = (long)(particles->
                     super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(particles->
                     super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)._M_impl.
                     super__Vector_impl_data._M_start;
      lVar8 = lVar10 >> 3;
      auVar11._8_4_ = (int)(lVar10 >> 0x23);
      auVar11._0_8_ = lVar8;
      auVar11._12_4_ = 0x45300000;
      ValuedAction::ValuedAction
                (&local_40,_action,
                 local_90 /
                 ((auVar11._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0)));
      VVar12._4_4_ = 0;
      VVar12.action = local_40.action;
      VVar12.value = local_40.value;
      return VVar12;
    }
    local_50 = ppSVar4[uVar9];
    local_58 = uVar9;
    iVar2 = (*model->_vptr_DSPOMDP[0x16])();
    lVar10 = CONCAT44(extraout_var,iVar2);
    iVar2 = 0;
    local_80 = 0.0;
    local_68 = 1.0;
    vnode = root;
    while( true ) {
      bVar1 = RandomStreams::Exhausted(streams);
      if (bVar1) break;
      if (vnode == (VNode *)0x0) {
        action = POMCPPrior::GetAction(prior,local_50);
      }
      else {
        action = UpperBoundAction(vnode,0.0);
      }
      RandomStreams::Entry(streams,*(int *)(lVar10 + 0x10));
      iVar3 = (*model->_vptr_DSPOMDP[2])(model,lVar10,(ulong)action,&local_48,&local_60);
      local_80 = local_80 + local_48 * local_68;
      if ((char)iVar3 != '\0') break;
      local_68 = local_68 * DAT_0019fdd8;
      (*prior->_vptr_POMCPPrior[6])(prior,(ulong)action,local_60);
      RandomStreams::Advance(streams);
      if (vnode == (VNode *)0x0) {
LAB_00173add:
        vnode = (mapped_type)0x0;
      }
      else {
        this = VNode::Child(vnode,action);
        this_00 = &QNode::children(this)->_M_t;
        iVar5 = std::
                _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_despot::VNode_*>,_std::_Select1st<std::pair<const_unsigned_long,_despot::VNode_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
                ::find(this_00,&local_60);
        if ((_Rb_tree_header *)iVar5._M_node == &(this_00->_M_impl).super__Rb_tree_header)
        goto LAB_00173add;
        ppVVar6 = std::
                  map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
                  ::operator[]((map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
                                *)this_00,&local_60);
        vnode = *ppVVar6;
      }
      iVar2 = iVar2 + 1;
    }
    while (bVar1 = iVar2 != 0, iVar2 = iVar2 + -1, bVar1) {
      RandomStreams::Back(streams);
      (*prior->_vptr_POMCPPrior[7])(prior);
    }
    (*model->_vptr_DSPOMDP[0x17])(model,lVar10);
    local_90 = local_90 + local_80;
    uVar9 = local_58 + 1;
    ppSVar4 = (particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    ppSVar7 = (particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
              _M_impl.super__Vector_impl_data._M_finish;
  } while( true );
}

Assistant:

ValuedAction POMCP::Evaluate(VNode* root, vector<State*>& particles,
	RandomStreams& streams, const DSPOMDP* model, POMCPPrior* prior) {
	double value = 0;

	for (int i = 0; i < particles.size(); i++)
		particles[i]->scenario_id = i;

	for (int i = 0; i < particles.size(); i++) {
		State* particle = particles[i];
		VNode* cur = root;
		State* copy = model->Copy(particle);
		double discount = 1.0;
		double val = 0;
		int steps = 0;

		// Simulate until all random numbers are consumed
		while (!streams.Exhausted()) {
			ACT_TYPE action =
				(cur != NULL) ?
					UpperBoundAction(cur, 0) : prior->GetAction(*particle);

			double reward;
			OBS_TYPE obs;
			bool terminal = model->Step(*copy, streams.Entry(copy->scenario_id),
				action, reward, obs);

			val += discount * reward;
			discount *= Globals::Discount();

			if (!terminal) {
				prior->Add(action, obs);
				streams.Advance();
				steps++;

				if (cur != NULL) {
					QNode* qnode = cur->Child(action);
					map<OBS_TYPE, VNode*>& vnodes = qnode->children();
					cur = vnodes.find(obs) != vnodes.end() ? vnodes[obs] : NULL;
				}
			} else {
				break;
			}
		}

		// Reset random streams and prior
		for (int i = 0; i < steps; i++) {
			streams.Back();
			prior->PopLast();
		}

		model->Free(copy);

		value += val;
	}

	return ValuedAction(UpperBoundAction(root, 0), value / particles.size());
}